

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O2

void __thiscall EditorInterface::~EditorInterface(EditorInterface *this)

{
  _Rb_tree_header *p_Var1;
  Theme *pTVar2;
  Gui *pGVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  uint uVar7;
  unsigned_long *in_R8;
  format_string_t<unsigned_int_&,_unsigned_long> fmt;
  format_string_t<const_std::__cxx11::basic_string<char>_&,_long> fmt_00;
  uint numLeakedWidgets;
  _Alloc_hider local_48;
  unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_> *local_40;
  undefined8 local_38;
  
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__EditorInterface_0026d948;
  std::__shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->cursorLabel_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>);
  pTVar2 = (this->theme_)._M_t.super___uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_>.
           _M_t.super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
           super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl;
  (this->theme_)._M_t.super___uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_>._M_t.
  super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
  super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl = (Theme *)0x0;
  if (pTVar2 != (Theme *)0x0) {
    (*pTVar2->_vptr_Theme[1])();
  }
  pGVar3 = (this->gui_)._M_t.super___uniq_ptr_impl<gui::Gui,_std::default_delete<gui::Gui>_>._M_t.
           super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>.
           super__Head_base<0UL,_gui::Gui_*,_false>._M_head_impl;
  (this->gui_)._M_t.super___uniq_ptr_impl<gui::Gui,_std::default_delete<gui::Gui>_>._M_t.
  super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>.
  super__Head_base<0UL,_gui::Gui_*,_false>._M_head_impl = (Gui *)0x0;
  if (pGVar3 != (Gui *)0x0) {
    (**(code **)((long)(pGVar3->super_ContainerBase)._vptr_ContainerBase + 8))();
  }
  local_40 = &this->theme_;
  numLeakedWidgets = 0;
  local_38 = &this->gui_;
  p_Var1 = &(this->debugWidgets_)._M_t._M_impl.super__Rb_tree_header;
  uVar7 = 0;
  for (p_Var5 = (this->debugWidgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if ((p_Var5[2]._M_parent != (_Base_ptr)0x0) && (*(int *)&(p_Var5[2]._M_parent)->_M_parent != 0))
    {
      uVar7 = uVar7 + 1;
      numLeakedWidgets = uVar7;
    }
  }
  if (uVar7 != 0) {
    local_48._M_p = (pointer)(this->debugWidgets_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    fmt.str.size_ = (size_t)&numLeakedWidgets;
    fmt.str.data_ = (char *)0x46;
    spdlog::warn<unsigned_int&,unsigned_long>
              ((spdlog *)"EditorInterface detected {} memory leaks out of {} registered widgets:",
               fmt,(uint *)&local_48,in_R8);
    for (p_Var6 = (this->debugWidgets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      p_Var4 = p_Var6[2]._M_parent;
      if ((p_Var4 != (_Base_ptr)0x0) && (*(int *)&p_Var4->_M_parent != 0)) {
        local_48._M_p = (pointer)(long)*(int *)&p_Var4->_M_parent;
        fmt_00.str.size_ = (size_t)(p_Var6 + 1);
        fmt_00.str.data_ = (char *)0x2d;
        spdlog::warn<std::__cxx11::string_const&,long>
                  ((spdlog *)"  Widget \"{}\" not cleaned up! (ref count {}).",fmt_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
                   (long *)in_R8);
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->cursorLabel_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<gui::Theme,_std::default_delete<gui::Theme>_>::~unique_ptr(local_40);
  std::unique_ptr<gui::Gui,_std::default_delete<gui::Gui>_>::~unique_ptr
            ((unique_ptr<gui::Gui,_std::default_delete<gui::Gui>_> *)local_38);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
  ::~_Rb_tree(&(this->debugWidgets_)._M_t);
  return;
}

Assistant:

EditorInterface::~EditorInterface() {
    modalBackground_.reset();
    cursorLabel_.reset();
    theme_.reset();
    gui_.reset();

    unsigned int numLeakedWidgets = 0;
    for (const auto& widget : debugWidgets_) {
        if (!widget.second.expired()) {
            ++numLeakedWidgets;
        }
    }

    if (numLeakedWidgets > 0) {
        spdlog::warn("EditorInterface detected {} memory leaks out of {} registered widgets:", numLeakedWidgets, debugWidgets_.size());
        for (const auto& widget : debugWidgets_) {
            if (!widget.second.expired()) {
                spdlog::warn("  Widget \"{}\" not cleaned up! (ref count {}).", widget.first, widget.second.use_count());
            }
        }
    }
}